

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

Precision *
icu_63::number::impl::stem_to_object::precision(Precision *__return_storage_ptr__,StemEnum stem)

{
  UCurrencyUsage currencyUsage;
  
  switch(stem) {
  default:
    Precision::integer();
    return __return_storage_ptr__;
  case STEM_PRECISION_UNLIMITED:
    Precision::unlimited();
    return __return_storage_ptr__;
  case STEM_PRECISION_CURRENCY_STANDARD:
    currencyUsage = UCURR_USAGE_STANDARD;
    break;
  case STEM_PRECISION_CURRENCY_CASH:
    currencyUsage = UCURR_USAGE_CASH;
  }
  Precision::currency(currencyUsage);
  return __return_storage_ptr__;
}

Assistant:

Precision stem_to_object::precision(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_PRECISION_INTEGER:
            return Precision::integer();
        case STEM_PRECISION_UNLIMITED:
            return Precision::unlimited();
        case STEM_PRECISION_CURRENCY_STANDARD:
            return Precision::currency(UCURR_USAGE_STANDARD);
        case STEM_PRECISION_CURRENCY_CASH:
            return Precision::currency(UCURR_USAGE_CASH);
        default:
            U_ASSERT(false);
            return Precision::integer(); // return a value: silence compiler warning
    }
}